

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O2

char * __thiscall cmStateDirectory::GetProperty(cmStateDirectory *this,string *prop,bool chain)

{
  pointer pcVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  __type _Var4;
  int iVar5;
  PointerType pBVar6;
  char *pcVar7;
  cmStateSnapshot *ci;
  pointer this_00;
  cmStateSnapshot parent;
  undefined1 local_70 [40];
  cmStateSnapshot snp;
  
  if ((GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_)
     , iVar5 != 0)) {
    GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p =
         (pointer)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_.field_2;
    GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_string_length = 0;
    GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_.field_2._M_local_buf[0] = '\0';
    __cxa_atexit(std::__cxx11::string::~string,
                 &GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
  }
  GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_string_length = 0;
  *GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p = '\0';
  bVar3 = std::operator==(prop,"PARENT_DIRECTORY");
  if (bVar3) {
    cmStateSnapshot::GetBuildsystemDirectoryParent(&parent,&this->Snapshot_);
    bVar3 = cmStateSnapshot::IsValid(&parent);
    if (bVar3) {
      cmStateSnapshot::GetDirectory((cmStateDirectory *)local_70,&parent);
      pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                         ((iterator *)local_70);
      return (pBVar6->Location)._M_dataplus._M_p;
    }
    return "";
  }
  _Var4 = std::operator==(prop,&kBINARY_DIR_abi_cxx11_);
  if (_Var4) {
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
              (&this->DirectoryState);
  }
  else {
    _Var4 = std::operator==(prop,&kSOURCE_DIR_abi_cxx11_);
    if (!_Var4) {
      _Var4 = std::operator==(prop,&kSUBDIRECTORIES_abi_cxx11_);
      if (_Var4) {
        parent._0_16_ = ZEXT816(0);
        parent.Position.Position = 0;
        pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                           (&this->DirectoryState);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&parent,
                  ((long)(pBVar6->Children).
                         super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(pBVar6->Children).
                        super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>.
                        _M_impl.super__Vector_impl_data._M_start) / 0x18);
        pcVar1 = (pBVar6->Children).
                 super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (this_00 = (pBVar6->Children).
                       super__Vector_base<cmStateSnapshot,_std::allocator<cmStateSnapshot>_>._M_impl
                       .super__Vector_impl_data._M_start; this_00 != pcVar1; this_00 = this_00 + 1)
        {
          cmStateSnapshot::GetDirectory((cmStateDirectory *)local_70,this_00);
          pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                             ((iterator *)local_70);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&parent,&pBVar6->Location);
        }
        cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  ((string *)local_70,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&parent,";");
      }
      else {
        _Var4 = std::operator==(prop,&kBUILDSYSTEM_TARGETS_abi_cxx11_);
        if (_Var4) {
          pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                             (&this->DirectoryState);
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_70,&pBVar6->NormalTargetNames,";");
LAB_00197dc3:
          std::__cxx11::string::operator=
                    ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                     (string *)local_70);
          std::__cxx11::string::~string((string *)local_70);
          return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p;
        }
        bVar3 = std::operator==(prop,"LISTFILE_STACK");
        if (bVar3) {
          parent.Position.Position = 0;
          parent._0_16_ = ZEXT816(0);
          snp.Position.Position = (this->Snapshot_).Position.Position;
          snp.State = (this->Snapshot_).State;
          snp.Position.Tree = (this->Snapshot_).Position.Tree;
          while (bVar3 = cmStateSnapshot::IsValid(&snp), bVar3) {
            cmStateSnapshot::GetExecutionListFile_abi_cxx11_((string *)local_70,&snp);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&parent,
                       (string *)local_70);
            std::__cxx11::string::~string((string *)local_70);
            cmStateSnapshot::GetCallStackParent((cmStateSnapshot *)local_70,&snp);
            snp.Position.Position = local_70._16_8_;
            snp.State = (cmState *)local_70._0_8_;
            snp.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_70._8_8_;
          }
          std::
          __reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                    (parent.State,parent.Position.Tree);
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_70,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&parent,";");
        }
        else {
          bVar3 = std::operator==(prop,"CACHE_VARIABLES");
          if (bVar3) {
            cmState::GetCacheEntryKeys_abi_cxx11_
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&parent,(this->Snapshot_).State);
            cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((string *)local_70,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&parent,";");
            std::__cxx11::string::operator=
                      ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                       (string *)local_70);
            std::__cxx11::string::~string((string *)local_70);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&parent);
            return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus._M_p
            ;
          }
          bVar3 = std::operator==(prop,"VARIABLES");
          if (!bVar3) {
            bVar3 = std::operator==(prop,"INCLUDE_DIRECTORIES");
            if (bVar3) {
              parent._0_16_ = GetIncludeDirectoriesEntries_abi_cxx11_(this);
            }
            else {
              bVar3 = std::operator==(prop,"COMPILE_OPTIONS");
              if (bVar3) {
                parent._0_16_ = GetCompileOptionsEntries_abi_cxx11_(this);
              }
              else {
                bVar3 = std::operator==(prop,"COMPILE_DEFINITIONS");
                if (bVar3) {
                  parent._0_16_ = GetCompileDefinitionsEntries_abi_cxx11_(this);
                }
                else {
                  bVar3 = std::operator==(prop,"LINK_OPTIONS");
                  if (bVar3) {
                    parent._0_16_ = GetLinkOptionsEntries_abi_cxx11_(this);
                  }
                  else {
                    bVar3 = std::operator==(prop,"LINK_DIRECTORIES");
                    if (!bVar3) {
                      pBVar6 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator
                               ::operator->(&this->DirectoryState);
                      pcVar7 = cmPropertyMap::GetPropertyValue(&pBVar6->Properties,prop);
                      if (!chain || pcVar7 != (char *)0x0) {
                        return pcVar7;
                      }
                      cmStateSnapshot::GetBuildsystemDirectoryParent(&parent,&this->Snapshot_);
                      bVar3 = cmStateSnapshot::IsValid(&parent);
                      if (bVar3) {
                        cmStateSnapshot::GetDirectory((cmStateDirectory *)local_70,&parent);
                        pcVar7 = GetProperty((cmStateDirectory *)local_70,prop,true);
                        return pcVar7;
                      }
                      pcVar7 = cmState::GetGlobalProperty((this->Snapshot_).State,prop);
                      return pcVar7;
                    }
                    parent._0_16_ = GetLinkDirectoriesEntries_abi_cxx11_(this);
                  }
                }
              }
            }
            cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                      ((string *)local_70,
                       (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&parent,";");
            goto LAB_00197dc3;
          }
          cmStateSnapshot::ClosureKeys_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&parent,&this->Snapshot_);
          cmState::GetCacheEntryKeys_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70,(this->Snapshot_).State);
          cmAppend<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&parent,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_70);
          std::
          __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (parent.State,parent.Position.Tree);
          cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    ((string *)local_70,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&parent,";");
        }
      }
      std::__cxx11::string::operator=
                ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_,
                 (string *)local_70);
      std::__cxx11::string::~string((string *)local_70);
      _Var2 = GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&parent);
      return _Var2._M_p;
    }
    cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
              (&this->DirectoryState);
  }
  std::__cxx11::string::_M_assign
            ((string *)&GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_);
  return GetProperty(std::__cxx11::string_const&,bool)::output_abi_cxx11_._M_dataplus;
}

Assistant:

const char* cmStateDirectory::GetProperty(const std::string& prop,
                                          bool chain) const
{
  static std::string output;
  output.clear();
  if (prop == "PARENT_DIRECTORY") {
    cmStateSnapshot parent = this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parent.IsValid()) {
      return parent.GetDirectory().GetCurrentSource().c_str();
    }
    return "";
  }
  if (prop == kBINARY_DIR) {
    output = this->GetCurrentBinary();
    return output.c_str();
  }
  if (prop == kSOURCE_DIR) {
    output = this->GetCurrentSource();
    return output.c_str();
  }
  if (prop == kSUBDIRECTORIES) {
    std::vector<std::string> child_dirs;
    std::vector<cmStateSnapshot> const& children =
      this->DirectoryState->Children;
    child_dirs.reserve(children.size());
    for (cmStateSnapshot const& ci : children) {
      child_dirs.push_back(ci.GetDirectory().GetCurrentSource());
    }
    output = cmJoin(child_dirs, ";");
    return output.c_str();
  }
  if (prop == kBUILDSYSTEM_TARGETS) {
    output = cmJoin(this->DirectoryState->NormalTargetNames, ";");
    return output.c_str();
  }

  if (prop == "LISTFILE_STACK") {
    std::vector<std::string> listFiles;
    cmStateSnapshot snp = this->Snapshot_;
    while (snp.IsValid()) {
      listFiles.push_back(snp.GetExecutionListFile());
      snp = snp.GetCallStackParent();
    }
    std::reverse(listFiles.begin(), listFiles.end());
    output = cmJoin(listFiles, ";");
    return output.c_str();
  }
  if (prop == "CACHE_VARIABLES") {
    output = cmJoin(this->Snapshot_.State->GetCacheEntryKeys(), ";");
    return output.c_str();
  }
  if (prop == "VARIABLES") {
    std::vector<std::string> res = this->Snapshot_.ClosureKeys();
    cmAppend(res, this->Snapshot_.State->GetCacheEntryKeys());
    std::sort(res.begin(), res.end());
    output = cmJoin(res, ";");
    return output.c_str();
  }
  if (prop == "INCLUDE_DIRECTORIES") {
    output = cmJoin(this->GetIncludeDirectoriesEntries(), ";");
    return output.c_str();
  }
  if (prop == "COMPILE_OPTIONS") {
    output = cmJoin(this->GetCompileOptionsEntries(), ";");
    return output.c_str();
  }
  if (prop == "COMPILE_DEFINITIONS") {
    output = cmJoin(this->GetCompileDefinitionsEntries(), ";");
    return output.c_str();
  }
  if (prop == "LINK_OPTIONS") {
    output = cmJoin(this->GetLinkOptionsEntries(), ";");
    return output.c_str();
  }
  if (prop == "LINK_DIRECTORIES") {
    output = cmJoin(this->GetLinkDirectoriesEntries(), ";");
    return output.c_str();
  }

  const char* retVal = this->DirectoryState->Properties.GetPropertyValue(prop);
  if (!retVal && chain) {
    cmStateSnapshot parentSnapshot =
      this->Snapshot_.GetBuildsystemDirectoryParent();
    if (parentSnapshot.IsValid()) {
      return parentSnapshot.GetDirectory().GetProperty(prop, chain);
    }
    return this->Snapshot_.State->GetGlobalProperty(prop);
  }

  return retVal;
}